

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidget.cpp
# Opt level: O2

State __thiscall QAccessibleWidget::state(QAccessibleWidget *this)

{
  bool bVar1;
  FocusPolicy FVar2;
  QWidget *this_00;
  QSize QVar3;
  QSize QVar4;
  State SVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  this_00 = widget(this);
  uVar6 = (~this_00->data->widget_attributes & 0x8000) * 4;
  FVar2 = QWidget::focusPolicy(this_00);
  uVar8 = uVar6 + 4;
  if (FVar2 == NoFocus) {
    uVar8 = uVar6;
  }
  bVar1 = QWidget::hasFocus(this_00);
  uVar6 = uVar8 + 8;
  if (!bVar1) {
    uVar6 = uVar8;
  }
  uVar8 = (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i;
  uVar6 = this_00->data->widget_attributes & 1 | uVar6;
  if ((uVar8 & 1) != 0) {
    QVar3 = QWidget::minimumSize(this_00);
    QVar4 = QWidget::maximumSize(this_00);
    uVar7 = uVar6 + 0x80000;
    if (QVar3 == QVar4) {
      uVar7 = uVar6;
    }
    uVar7 = uVar7 + (uVar8 & 0x2000) * 0x80;
    bVar1 = QWidget::isActiveWindow(this_00);
    uVar6 = uVar7 + 0x40000000;
    if (!bVar1) {
      uVar6 = uVar7;
    }
  }
  SVar5._4_4_ = 0;
  SVar5._0_4_ = uVar6;
  return SVar5;
}

Assistant:

QAccessible::State QAccessibleWidget::state() const
{
    QAccessible::State state;

    QWidget *w = widget();
    if (w->testAttribute(Qt::WA_WState_Visible) == false)
        state.invisible = true;
    if (w->focusPolicy() != Qt::NoFocus)
        state.focusable = true;
    if (w->hasFocus())
        state.focused = true;
    if (!w->isEnabled())
        state.disabled = true;
    if (w->isWindow()) {
        if (w->windowFlags() & Qt::WindowSystemMenuHint)
            state.movable = true;
        if (w->minimumSize() != w->maximumSize())
            state.sizeable = true;
        if (w->isActiveWindow())
            state.active = true;
    }

    return state;
}